

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void __thiscall crnlib::crn_comp::optimize_color_selectors(crn_comp *this)

{
  ushort uVar1;
  uint32 i_1;
  uint uVar2;
  uint min_error;
  uint uVar3;
  uint uVar4;
  vector<unsigned_short> *this_00;
  ulong uVar5;
  ulong uVar6;
  uint16 i_3;
  ulong uVar7;
  uint16 i;
  ulong uVar8;
  uint uVar9;
  vector<unsigned_short> indices;
  vector<unsigned_int> selectors;
  uint8 D4 [256];
  uint8 D8 [65536];
  
  this_00 = this->m_selector_remaping;
  uVar4 = (this->m_color_selectors).m_size;
  uVar1 = (ushort)uVar4;
  vector<unsigned_short>::resize(this_00,uVar4 & 0xffff,false);
  for (uVar8 = 0; uVar8 != 0x100; uVar8 = uVar8 + 1) {
    D4[uVar8] = (&DAT_001951b8)[(uint)(uVar8 >> 2) & 3 ^ (uint)(uVar8 >> 6) & 0x3ffffff] +
                (&DAT_001951b8)[((uint)(uVar8 >> 4) & 0xfffffff ^ (uint)uVar8) & 3];
  }
  for (uVar8 = 0; uVar8 != 0x10000; uVar8 = uVar8 + 1) {
    uVar3 = (uint)(uVar8 >> 4);
    D8[uVar8] = D4[(uint)uVar8 & 0xf | uVar3 & 0xf0] + D4[uVar3 & 0xf | (uint)(uVar8 >> 8) & 0xf0];
  }
  vector<unsigned_int>::vector(&selectors,uVar4 & 0xffff);
  vector<unsigned_short>::vector(&indices,uVar4 & 0xffff);
  for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
    selectors.m_p[uVar8] = (this->m_color_selectors).m_p[uVar8];
    indices.m_p[uVar8] = (unsigned_short)uVar8;
  }
  uVar4 = 0;
  uVar8 = (ulong)uVar1;
  while (uVar5 = uVar8 - 1, uVar8 != 0) {
    uVar2 = 0;
    uVar3 = 0xffffffff;
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      uVar9 = selectors.m_p[uVar7];
      uVar9 = (uint)D8[(uVar9 & 0xff) << 8 | uVar4 & 0xff] +
              (uint)D8[uVar9 & 0xff00 | uVar4 >> 8 & 0xff] +
              (uint)D8[uVar9 >> 8 & 0xff00 | uVar4 >> 0x10 & 0xff] +
              (uint)D8[uVar9 >> 0x10 & 0xff00 | uVar4 >> 0x18];
      if (uVar9 < uVar3) {
        uVar3 = uVar9;
        uVar2 = (uint)uVar7;
      }
    }
    uVar6 = (ulong)((uVar2 & 0xffff) * 4);
    uVar4 = *(uint *)((long)selectors.m_p + uVar6);
    uVar7 = (ulong)((uVar2 & 0xffff) * 2);
    this_00->m_p[*(ushort *)((long)indices.m_p + uVar7)] = uVar1 - (short)uVar8;
    *(uint *)((long)selectors.m_p + uVar6) = selectors.m_p[uVar5];
    *(unsigned_short *)((long)indices.m_p + uVar7) = indices.m_p[uVar5];
    uVar8 = uVar5;
  }
  pack_color_selectors(this,&this->m_packed_color_selectors,this_00);
  vector<unsigned_short>::~vector(&indices);
  vector<unsigned_int>::~vector(&selectors);
  return;
}

Assistant:

void crn_comp::optimize_color_selectors() {
  crnlib::vector<uint16>& remapping = m_selector_remaping[cColor];
  uint16 n = m_color_selectors.size();
  remapping.resize(n);

  uint8 d[] = {0, 5, 14, 10};

  uint8 D4[0x100];
  for (uint16 i = 0; i < 0x100; i++)
    D4[i] = d[(i ^ i >> 4) & 3] + d[(i >> 2 ^ i >> 6) & 3];
  uint8 D8[0x10000];
  for (uint32 i = 0; i < 0x10000; i++)
    D8[i] = D4[(i >> 8 & 0xF0) | (i >> 4 & 0xF)] + D4[(i >> 4 & 0xF0) | (i & 0xF)];

  crnlib::vector<uint32> selectors(n);
  crnlib::vector<uint16> indices(n);
  for (uint16 i = 0; i < n; i++) {
    selectors[i] = m_color_selectors[i];
    indices[i] = i;
  }
  uint32 selected_selector = 0;
  for (uint16 left = n; left;) {
    uint16 selected_index = 0;
    uint min_error = cUINT32_MAX;
    for (uint16 i = 0; i < left; i++) {
      uint32 selector = selectors[i];
      uint8 d0 = D8[(selector >> 16 & 0xFF00) | (selected_selector >> 24 & 0xFF)];
      uint8 d1 = D8[(selector >> 8 & 0xFF00) | (selected_selector >> 16 & 0xFF)];
      uint8 d2 = D8[(selector & 0xFF00) | (selected_selector >> 8 & 0xFF)];
      uint8 d3 = D8[(selector << 8 & 0xFF00) | (selected_selector & 0xFF)];
      uint error = d0 + d1 + d2 + d3;
      if (error < min_error) {
        min_error = error;
        selected_index = i;
      }
    }
    selected_selector = selectors[selected_index];
    remapping[indices[selected_index]] = n - left;
    left--;
    selectors[selected_index] = selectors[left];
    indices[selected_index] = indices[left];
  }

  pack_color_selectors(m_packed_color_selectors, remapping);
}